

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O2

void __thiscall QTimer::setInterval(QTimer *this,milliseconds interval)

{
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  *this_00;
  TimerId id;
  int iVar1;
  QObjectData *pQVar2;
  parameter_type timerType;
  int iVar3;
  milliseconds mVar4;
  int iVar5;
  
  pQVar2 = (this->super_QObject).d_ptr.d;
  mVar4 = checkInterval("QTimer::setInterval",interval);
  this_00 = (QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
             *)((long)&pQVar2[1].children.d.size + 4);
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  id = (TimerId)pQVar2[1].children.d.size;
  iVar1 = *(int *)((long)&pQVar2[1].children.d.size + 4);
  iVar5 = (int)mVar4.__r;
  *(int *)((long)&pQVar2[1].children.d.size + 4) = iVar5;
  if (0 < (int)id) {
    QObject::killTimer(&this->super_QObject,id);
    timerType = QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                ::value((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                         *)((long)&pQVar2[1].metaObject + 4));
    iVar3 = QObject::startTimer(&this->super_QObject,(nanoseconds)((long)iVar5 * 1000000),timerType)
    ;
    if (iVar3 < 1) {
      *(undefined4 *)&pQVar2[1].children.d.size = 0;
      QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
      ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
                *)&pQVar2[1].bindingStorage);
    }
    else {
      *(int *)&pQVar2[1].children.d.size = iVar3;
    }
  }
  if (iVar1 == iVar5) {
    return;
  }
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  ::notify(this_00);
  return;
}

Assistant:

void QTimer::setInterval(std::chrono::milliseconds interval)
{
    Q_D(QTimer);

    interval = checkInterval("QTimer::setInterval", interval);
    const int msec = interval.count();
    d->inter.removeBindingUnlessInWrapper();
    const bool intervalChanged = msec != d->inter.valueBypassingBindings();
    d->inter.setValueBypassingBindings(msec);
    if (d->isActive()) { // create new timer
        QObject::killTimer(d->id);                        // restart timer
        Qt::TimerId newId{ QObject::startTimer(msec * 1ms, d->type) };  // overflow impossible
        if (newId > Qt::TimerId::Invalid) {
            // Restarted successfully. No need to update the active state.
            d->id = newId;
        } else {
            // Failed to start the timer.
            // Need to notify about active state change.
            d->id = Qt::TimerId::Invalid;
            d->isActiveData.notify();
        }
    }
    if (intervalChanged)
        d->inter.notify();
}